

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdom.cpp
# Opt level: O0

void __thiscall
QDomElementPrivate::save(QDomElementPrivate *this,QTextStream *s,int depth,int indent)

{
  Data *pDVar1;
  long lVar2;
  QKeyValueIterator<const_QString_&,_QDomNodePrivate_*const_&,_QMultiHash<QString,_QDomNodePrivate_*>::const_iterator>
  lhs;
  QKeyValueIterator<const_QString_&,_QDomNodePrivate_*const_&,_QMultiHash<QString,_QDomNodePrivate_*>::const_iterator>
  rhs;
  bool bVar3;
  QTextStream *pQVar4;
  QString *str_00;
  iterator pSVar5;
  iterator pSVar6;
  int in_ECX;
  int in_EDX;
  QTextStream *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  QStringBuilder<const_QString_&,_char16_t> QVar7;
  SavedAttribute *attr_1;
  iterator __end2_1;
  iterator __begin2_1;
  QVarLengthArray<SavedAttribute,_8LL> *__range2_1;
  bool mayNeedXmlNS;
  QDomNodePrivate **value;
  QString *key;
  QKeyValueRange<const_QMultiHash<QString,_QDomNodePrivate_*>_&> *__range2;
  char16_t *str;
  anon_class_1_0_00000001 savedAttributeComparator;
  SavedAttribute nsAttr;
  SavedAttribute attr;
  const_key_value_iterator __end2;
  const_key_value_iterator __begin2;
  QString nsDecl;
  QString qName;
  QDuplicateTracker<QString,_32UL> outputtedPrefixes;
  QVarLengthArray<SavedAttribute,_8LL> attributesToSave;
  SavedAttribute *in_stack_fffffffffffff328;
  QDuplicateTracker<QString,_32UL> *in_stack_fffffffffffff330;
  QStringBuilder<QString,_QString> *in_stack_fffffffffffff338;
  QDuplicateTracker<QString,_32UL> *this_00;
  QDuplicateTracker<QString,_32UL> *in_stack_fffffffffffff340;
  QVarLengthArray<SavedAttribute,_8LL> *this_01;
  char16_t *in_stack_fffffffffffff348;
  Data<QHashPrivate::MultiNode<QString,_QDomNodePrivate_*>_> *this_02;
  QStringBuilder<QStringBuilder<QString,_QString>,_char16_t> *in_stack_fffffffffffff358;
  QString *in_stack_fffffffffffff360;
  int local_c94;
  iterator local_c70;
  undefined1 in_stack_fffffffffffff3a5;
  undefined1 in_stack_fffffffffffff3a6;
  undefined1 in_stack_fffffffffffff3a7;
  byte encodeQuotes;
  QString *in_stack_fffffffffffff3a8;
  QArrayDataPointer<char16_t> local_be8 [2];
  undefined1 local_bb8 [24];
  QString aQStack_ba0 [3];
  QString local_b58;
  QString aQStack_b40 [2];
  pair<const_QString_&,_QDomNodePrivate_*const_&> local_b10;
  QVarLengthArray<SavedAttribute,_8LL> *local_b00;
  Data<QHashPrivate::MultiNode<QString,_QDomNodePrivate_*>_> *local_af8;
  undefined1 *local_af0;
  SavedAttribute *local_ae8;
  QDuplicateTracker<QString,_32UL> *local_ae0;
  QDuplicateTracker<QString,_32UL> *local_ad8;
  QVarLengthArray<SavedAttribute,_8LL> *local_ad0;
  Data<QHashPrivate::MultiNode<QString,_QDomNodePrivate_*>_> *local_ac8;
  undefined1 *local_ac0;
  SavedAttribute *local_ab8;
  QDuplicateTracker<QString,_32UL> *local_ab0;
  QDuplicateTracker<QString,_32UL> *local_aa8;
  QKeyValueRangeStorage<const_QMultiHash<QString,_QDomNodePrivate_*>_&> local_aa0;
  undefined2 local_a92;
  QString *local_9e0;
  char16_t local_9d8;
  undefined2 local_9ca;
  undefined1 *local_998;
  undefined1 *local_990;
  undefined1 *local_988;
  undefined1 *local_980;
  undefined1 *local_978;
  undefined1 *local_970;
  QChar local_962;
  QString local_960 [3];
  QString *local_910;
  char16_t local_908;
  undefined1 local_8e8 [1672];
  QVarLengthArray<SavedAttribute,_8LL> local_260;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*(long *)(in_RDI + 0x10) == 0) ||
     (bVar3 = QDomNodePrivate::isText((QDomNodePrivate *)in_stack_fffffffffffff330), !bVar3)) {
    if (in_ECX < 1) {
      local_c94 = 0;
    }
    else {
      local_c94 = in_EDX * in_ECX;
    }
    in_stack_fffffffffffff360 = (QString *)(long)local_c94;
    QChar::QChar<char16_t,_true>(&local_962,L' ');
    QString::QString(local_960,(longlong)in_stack_fffffffffffff360,local_962);
    QTextStream::operator<<(in_RSI,(QString *)local_960);
    QString::~QString((QString *)0x11672c);
  }
  local_980 = &DAT_aaaaaaaaaaaaaaaa;
  local_978 = &DAT_aaaaaaaaaaaaaaaa;
  local_970 = &DAT_aaaaaaaaaaaaaaaa;
  QString::QString((QString *)in_stack_fffffffffffff330,&in_stack_fffffffffffff328->prefix);
  local_998 = &DAT_aaaaaaaaaaaaaaaa;
  local_990 = &DAT_aaaaaaaaaaaaaaaa;
  local_988 = &DAT_aaaaaaaaaaaaaaaa;
  Qt::Literals::StringLiterals::operator____s
            (in_stack_fffffffffffff348,(size_t)in_stack_fffffffffffff340);
  bVar3 = QString::isNull((QString *)0x1167c5);
  if (!bVar3) {
    bVar3 = QString::isEmpty((QString *)0x1167db);
    if (bVar3) {
      Qt::Literals::StringLiterals::operator____s
                (in_stack_fffffffffffff348,(size_t)in_stack_fffffffffffff340);
      QString::operator=((QString *)in_stack_fffffffffffff330,&in_stack_fffffffffffff328->prefix);
      QString::~QString((QString *)0x11681c);
    }
    else {
      local_9ca = 0x3a;
      QVar7 = operator+(&in_stack_fffffffffffff338->a,(char16_t *)in_stack_fffffffffffff330);
      local_9e0 = QVar7.a;
      local_9d8 = QVar7.b;
      local_910 = local_9e0;
      local_908 = local_9d8;
      operator+((QStringBuilder<const_QString_&,_char16_t> *)in_stack_fffffffffffff330,
                &in_stack_fffffffffffff328->prefix);
      QStringBuilder::operator_cast_to_QString
                ((QStringBuilder<QStringBuilder<const_QString_&,_char16_t>,_const_QString_&> *)
                 in_stack_fffffffffffff328);
      QString::operator=((QString *)in_stack_fffffffffffff330,&in_stack_fffffffffffff328->prefix);
      QString::~QString((QString *)0x1168c9);
      Qt::Literals::StringLiterals::operator____s
                (in_stack_fffffffffffff348,(size_t)in_stack_fffffffffffff340);
      operator+(&in_stack_fffffffffffff338->a,(QString *)in_stack_fffffffffffff330);
      QStringBuilder::operator_cast_to_QString
                ((QStringBuilder<QString,_const_QString_&> *)in_stack_fffffffffffff328);
      QString::operator=((QString *)in_stack_fffffffffffff330,&in_stack_fffffffffffff328->prefix);
      QString::~QString((QString *)0x116937);
      QStringBuilder<QString,_const_QString_&>::~QStringBuilder
                ((QStringBuilder<QString,_const_QString_&> *)0x116944);
      QString::~QString((QString *)0x116951);
    }
    Qt::Literals::StringLiterals::operator____s
              (in_stack_fffffffffffff348,(size_t)in_stack_fffffffffffff340);
    encodeText(in_stack_fffffffffffff3a8,(bool)in_stack_fffffffffffff3a7,
               (bool)in_stack_fffffffffffff3a6,(bool)in_stack_fffffffffffff3a5);
    operator+(&in_stack_fffffffffffff338->a,(QString *)in_stack_fffffffffffff330);
    local_a92 = 0x22;
    operator+(in_stack_fffffffffffff338,(char16_t *)in_stack_fffffffffffff330);
    operator+=(in_stack_fffffffffffff360,in_stack_fffffffffffff358);
    QStringBuilder<QStringBuilder<QString,_QString>,_char16_t>::~QStringBuilder
              ((QStringBuilder<QStringBuilder<QString,_QString>,_char16_t> *)0x1169f4);
    QStringBuilder<QString,_QString>::~QStringBuilder
              ((QStringBuilder<QString,_QString> *)in_stack_fffffffffffff330);
    QString::~QString((QString *)0x116a0e);
    QString::~QString((QString *)0x116a1b);
  }
  pQVar4 = (QTextStream *)QTextStream::operator<<(in_RSI,'<');
  pQVar4 = (QTextStream *)QTextStream::operator<<(pQVar4,(QString *)&local_980);
  QTextStream::operator<<(pQVar4,(QString *)&local_998);
  bVar3 = QMultiHash<QString,_QDomNodePrivate_*>::isEmpty
                    ((QMultiHash<QString,_QDomNodePrivate_*> *)(*(long *)(in_RDI + 0xa8) + 8));
  if (!bVar3) {
    memset(&local_260,0xaa,600);
    QVarLengthArray<SavedAttribute,_8LL>::QVarLengthArray(&local_260);
    QMultiHash<QString,_QDomNodePrivate_*>::size
              ((QMultiHash<QString,_QDomNodePrivate_*> *)(*(long *)(in_RDI + 0xa8) + 8));
    QVarLengthArray<SavedAttribute,_8LL>::reserve
              ((QVarLengthArray<SavedAttribute,_8LL> *)in_stack_fffffffffffff340,
               (qsizetype)in_stack_fffffffffffff338);
    memcpy(local_8e8,&DAT_00136258,0x688);
    QDuplicateTracker<QString,_32UL>::QDuplicateTracker(in_stack_fffffffffffff340);
    local_aa0.m_map =
         (QMultiHash<QString,_QDomNodePrivate_*> *)
         QMultiHash<QString,_QDomNodePrivate_*>::asKeyValueRange
                   ((QMultiHash<QString,_QDomNodePrivate_*> *)in_stack_fffffffffffff330);
    local_ab8 = (SavedAttribute *)&DAT_aaaaaaaaaaaaaaaa;
    local_ab0 = (QDuplicateTracker<QString,_32UL> *)&DAT_aaaaaaaaaaaaaaaa;
    local_aa8 = (QDuplicateTracker<QString,_32UL> *)&DAT_aaaaaaaaaaaaaaaa;
    QtPrivate::QKeyValueRange<const_QMultiHash<QString,_QDomNodePrivate_*>_&>::begin
              ((QKeyValueRange<const_QMultiHash<QString,_QDomNodePrivate_*>_&> *)
               in_stack_fffffffffffff330);
    local_ad0 = (QVarLengthArray<SavedAttribute,_8LL> *)&DAT_aaaaaaaaaaaaaaaa;
    local_ac8 = (Data<QHashPrivate::MultiNode<QString,_QDomNodePrivate_*>_> *)&DAT_aaaaaaaaaaaaaaaa;
    local_ac0 = &DAT_aaaaaaaaaaaaaaaa;
    QtPrivate::QKeyValueRange<const_QMultiHash<QString,_QDomNodePrivate_*>_&>::end
              ((QKeyValueRange<const_QMultiHash<QString,_QDomNodePrivate_*>_&> *)
               in_stack_fffffffffffff330);
    while( true ) {
      local_ae8 = local_ab8;
      local_ae0 = local_ab0;
      local_ad8 = local_aa8;
      local_b00 = local_ad0;
      local_af8 = local_ac8;
      local_af0 = local_ac0;
      lhs.i.i.bucket = (size_t)local_aa8;
      lhs.i.i.d = (Data<QHashPrivate::MultiNode<QString,_QDomNodePrivate_*>_> *)local_ab0;
      lhs.i.e = (Chain **)local_ad0;
      rhs.i.i.bucket = (size_t)local_ac0;
      rhs.i.i.d = local_ac8;
      rhs.i.e = (Chain **)in_stack_fffffffffffff358;
      in_stack_fffffffffffff328 = local_ab8;
      in_stack_fffffffffffff330 = local_ab0;
      this_00 = local_aa8;
      this_01 = local_ad0;
      this_02 = local_ac8;
      bVar3 = operator!=(lhs,rhs);
      if (!bVar3) break;
      local_b10 = QKeyValueIterator<const_QString_&,_QDomNodePrivate_*const_&,_QMultiHash<QString,_QDomNodePrivate_*>::const_iterator>
                  ::operator*((QKeyValueIterator<const_QString_&,_QDomNodePrivate_*const_&,_QMultiHash<QString,_QDomNodePrivate_*>::const_iterator>
                               *)this_02);
      std::get<0ul,QString_const&,QDomNodePrivate*const&>
                ((pair<const_QString_&,_QDomNodePrivate_*const_&> *)0x116cab);
      str_00 = (QString *)
               std::get<1ul,QString_const&,QDomNodePrivate*const&>
                         ((pair<const_QString_&,_QDomNodePrivate_*const_&> *)0x116cd2);
      encodeQuotes = 0;
      memset(&local_b58,0xaa,0x48);
      save::SavedAttribute::SavedAttribute((SavedAttribute *)in_stack_fffffffffffff330);
      QString::operator=(aQStack_b40,(QString *)&((QDomNodePrivate *)(str_00->d).d)->name);
      encodeText(str_00,(bool)encodeQuotes,(bool)in_stack_fffffffffffff3a6,
                 (bool)in_stack_fffffffffffff3a5);
      QString::operator=((QString *)in_stack_fffffffffffff330,&in_stack_fffffffffffff328->prefix);
      QString::~QString((QString *)0x116d6f);
      bVar3 = QString::isNull((QString *)0x116d86);
      if (!bVar3) {
        QString::operator=(&local_b58,(QString *)&(str_00->d).d[6].super_QArrayData.alloc);
        encodeQuotes = 1;
      }
      QVarLengthArray<SavedAttribute,_8LL>::push_back
                ((QVarLengthArray<SavedAttribute,_8LL> *)in_stack_fffffffffffff330,
                 in_stack_fffffffffffff328);
      if (((encodeQuotes & 1) != 0) &&
         (((pDVar1 = (str_00->d).d, lVar2._0_4_ = pDVar1[2].super_QArrayData.ref_,
           lVar2._4_4_ = pDVar1[2].super_QArrayData.flags, lVar2 == 0 ||
           (bVar3 = operator!=((QString *)in_stack_fffffffffffff330,
                               &in_stack_fffffffffffff328->prefix), bVar3)) &&
          (bVar3 = QDuplicateTracker<QString,_32UL>::hasSeen
                             (this_00,(QString *)in_stack_fffffffffffff330), !bVar3)))) {
        memset(local_bb8,0xaa,0x48);
        save::SavedAttribute::SavedAttribute((SavedAttribute *)in_stack_fffffffffffff330);
        QArrayDataPointer<char16_t>::QArrayDataPointer(local_be8,(Data *)0x0,L"xmlns",5);
        QString::QString((QString *)in_stack_fffffffffffff330,
                         (DataPointer *)in_stack_fffffffffffff328);
        QString::operator=((QString *)in_stack_fffffffffffff330,&in_stack_fffffffffffff328->prefix);
        QString::~QString((QString *)0x116ed9);
        QArrayDataPointer<char16_t>::~QArrayDataPointer
                  ((QArrayDataPointer<char16_t> *)in_stack_fffffffffffff330);
        QString::operator=(aQStack_ba0,(QString *)&(str_00->d).d[6].super_QArrayData.alloc);
        encodeText(str_00,(bool)encodeQuotes,(bool)in_stack_fffffffffffff3a6,
                   (bool)in_stack_fffffffffffff3a5);
        QString::operator=((QString *)in_stack_fffffffffffff330,&in_stack_fffffffffffff328->prefix);
        QString::~QString((QString *)0x116f55);
        QVarLengthArray<SavedAttribute,_8LL>::push_back
                  ((QVarLengthArray<SavedAttribute,_8LL> *)in_stack_fffffffffffff330,
                   in_stack_fffffffffffff328);
        save::SavedAttribute::~SavedAttribute((SavedAttribute *)in_stack_fffffffffffff330);
      }
      save::SavedAttribute::~SavedAttribute((SavedAttribute *)in_stack_fffffffffffff330);
      QKeyValueIterator<const_QString_&,_QDomNodePrivate_*const_&,_QMultiHash<QString,_QDomNodePrivate_*>::const_iterator>
      ::operator++((QKeyValueIterator<const_QString_&,_QDomNodePrivate_*const_&,_QMultiHash<QString,_QDomNodePrivate_*>::const_iterator>
                    *)in_stack_fffffffffffff330);
    }
    pSVar5 = QVLABase<SavedAttribute>::begin((QVLABase<SavedAttribute> *)0x116fb0);
    pSVar6 = QVLABase<SavedAttribute>::end((QVLABase<SavedAttribute> *)in_stack_fffffffffffff330);
    std::
    sort<QDomElementPrivate::save(QTextStream&,int,int)const::SavedAttribute*,QDomElementPrivate::save(QTextStream&,int,int)const::__0>
              (pSVar5,pSVar6);
    local_c70 = QVLABase<SavedAttribute>::begin((QVLABase<SavedAttribute> *)0x116ff5);
    pSVar5 = QVLABase<SavedAttribute>::end((QVLABase<SavedAttribute> *)in_stack_fffffffffffff330);
    for (; local_c70 != pSVar5; local_c70 = local_c70 + 1) {
      QTextStream::operator<<(in_RSI,' ');
      bVar3 = QString::isEmpty((QString *)0x11704e);
      if (!bVar3) {
        pQVar4 = (QTextStream *)QTextStream::operator<<(in_RSI,(QString *)local_c70);
        QTextStream::operator<<(pQVar4,':');
      }
      pQVar4 = (QTextStream *)QTextStream::operator<<(in_RSI,(QString *)&local_c70->name);
      pQVar4 = (QTextStream *)QTextStream::operator<<(pQVar4,"=\"");
      pQVar4 = (QTextStream *)QTextStream::operator<<(pQVar4,(QString *)&local_c70->encodedValue);
      QTextStream::operator<<(pQVar4,'\"');
    }
    QDuplicateTracker<QString,_32UL>::~QDuplicateTracker(in_stack_fffffffffffff330);
    QVarLengthArray<SavedAttribute,_8LL>::~QVarLengthArray(this_01);
  }
  if (*(long *)(in_RDI + 0x30) == 0) {
    QTextStream::operator<<(in_RSI,"/>");
  }
  else {
    bVar3 = QDomNodePrivate::isText((QDomNodePrivate *)in_stack_fffffffffffff330);
    if (bVar3) {
      QTextStream::operator<<(in_RSI,'>');
    }
    else {
      QTextStream::operator<<(in_RSI,'>');
      if (in_ECX != -1) {
        operator<<((QTextStream *)in_stack_fffffffffffff330,
                   (QTextStreamFunction)in_stack_fffffffffffff328);
      }
    }
  }
  QString::~QString((QString *)0x11716a);
  QString::~QString((QString *)0x117177);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QDomElementPrivate::save(QTextStream& s, int depth, int indent) const
{
    if (!(prev && prev->isText()))
        s << QString(indent < 1 ? 0 : depth * indent, u' ');

    QString qName(name);
    QString nsDecl(u""_s);
    if (!namespaceURI.isNull()) {
        /** ###
         *
         * If we still have QDom, optimize this so that we only declare namespaces that are not
         * yet declared. We loose default namespace mappings, so maybe we should rather store
         * the information that we get from startPrefixMapping()/endPrefixMapping() and use them.
         * Modifications becomes more complex then, however.
         *
         * We cannot do this in a patch release because it would require too invasive changes, and
         * hence possibly behavioral changes.
         */
        if (prefix.isEmpty()) {
            nsDecl = u" xmlns"_s;
        } else {
            qName = prefix + u':' + name;
            nsDecl = u" xmlns:"_s + prefix;
        }
        nsDecl += u"=\""_s + encodeText(namespaceURI) + u'\"';
    }
    s << '<' << qName << nsDecl;


    /* Write out attributes. */
    if (!m_attr->map.isEmpty()) {
        /*
         * To ensure that we always output attributes in a consistent
         * order, sort the attributes before writing them into the
         * stream. (Note that the order may be different than the one
         * that e.g. we've read from a file, or the program order in
         * which these attributes have been populated. We just want to
         * guarantee reproducibile outputs.)
         */
        struct SavedAttribute {
            QString prefix;
            QString name;
            QString encodedValue;
        };

        /* Gather all the attributes to save. */
        QVarLengthArray<SavedAttribute, 8> attributesToSave;
        attributesToSave.reserve(m_attr->map.size());

        QDuplicateTracker<QString> outputtedPrefixes;
        for (const auto &[key, value] : std::as_const(m_attr->map).asKeyValueRange()) {
            Q_UNUSED(key); /* We extract the attribute name from the value. */
            bool mayNeedXmlNS = false;

            SavedAttribute attr;
            attr.name = value->name;
            attr.encodedValue = encodeText(value->value, true, true);
            if (!value->namespaceURI.isNull()) {
                attr.prefix = value->prefix;
                mayNeedXmlNS = true;
            }

            attributesToSave.push_back(std::move(attr));

            /*
             * This is a fix for 138243, as good as it gets.
             *
             * QDomElementPrivate::save() output a namespace
             * declaration if the element is in a namespace, no matter
             * what. This function do as well, meaning that we get two
             * identical namespace declaration if we don't have the if-
             * statement below.
             *
             * This doesn't work when the parent element has the same
             * prefix as us but a different namespace. However, this
             * can only occur by the user modifying the element, and we
             * don't do fixups by that anyway, and hence it's the user
             * responsibility to avoid those situations.
             */

            if (mayNeedXmlNS
                && ((!value->ownerNode || value->ownerNode->prefix != value->prefix)
                    && !outputtedPrefixes.hasSeen(value->prefix)))
            {
                SavedAttribute nsAttr;
                nsAttr.prefix = QStringLiteral("xmlns");
                nsAttr.name = value->prefix;
                nsAttr.encodedValue = encodeText(value->namespaceURI, true, true);
                attributesToSave.push_back(std::move(nsAttr));
            }
        }

        /* Sort the attributes by prefix and name. */
        const auto savedAttributeComparator = [](const SavedAttribute &lhs, const SavedAttribute &rhs)
        {
            const int cmp = QString::compare(lhs.prefix, rhs.prefix);
            return (cmp < 0) || ((cmp == 0) && (lhs.name < rhs.name));
        };

        std::sort(attributesToSave.begin(), attributesToSave.end(), savedAttributeComparator);

        /* Actually stream the sorted attributes. */
        for (const auto &attr : attributesToSave) {
            s << ' ';
            if (!attr.prefix.isEmpty())
                s << attr.prefix << ':';
            s << attr.name << "=\"" << attr.encodedValue << '\"';
        }
    }

    if (last) {
        // has child nodes
        if (first->isText())
            s << '>';
        else {
            s << '>';

            /* -1 disables new lines. */
            if (indent != -1)
                s << Qt::endl;
        }
    } else {
        s << "/>";
    }
}